

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_resume_data.cpp
# Opt level: O0

entry * libtorrent::anon_unknown_24::build_tracker_list
                  (entry *__return_storage_ptr__,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *trackers,vector<int,_std::allocator<int>_> *tracker_tiers)

{
  vector<int,_std::allocator<int>_> *this;
  bool bVar1;
  reference piVar2;
  unsigned_long *puVar3;
  int *piVar4;
  reference this_00;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *pvVar5;
  unsigned_long local_b0 [2];
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  unsigned_long local_98;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  reference local_88;
  string *tr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  const_iterator tier_it;
  size_t tier;
  pointer peStack_50;
  pointer local_48;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *local_30;
  list_type *tr_list;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *tracker_tiers_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *trackers_local;
  entry *ret;
  
  tr_list._7_1_ = 0;
  local_20 = tracker_tiers;
  tracker_tiers_local = (vector<int,_std::allocator<int>_> *)trackers;
  trackers_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)__return_storage_ptr__;
  entry::entry(__return_storage_ptr__);
  local_30 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
             entry::list(__return_storage_ptr__);
  bVar1 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)tracker_tiers_local);
  pvVar5 = local_30;
  if (!bVar1) {
    tier = 0;
    peStack_50 = (pointer)0x0;
    local_48 = (pointer)0x0;
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::vector
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)&tier);
    ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
    emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
              (pvVar5,(vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)&tier);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)&tier);
    tier_it._M_current = (int *)0x0;
    __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)::std::vector<int,_std::allocator<int>_>::begin(local_20);
    this = tracker_tiers_local;
    __end2 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)tracker_tiers_local);
    tr = (string *)
         ::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&tr), bVar1) {
      local_88 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      local_90._M_current = (int *)::std::vector<int,_std::allocator<int>_>::end(local_20);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &__range2,&local_90);
      if (bVar1) {
        local_a0 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator++((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)&__range2,0);
        piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_a0);
        local_98 = (unsigned_long)*piVar2;
        local_b0[1] = 0;
        local_b0[0] = 0x400;
        puVar3 = ::std::clamp<unsigned_long>(&local_98,local_b0 + 1,local_b0);
        tier_it._M_current = (int *)*puVar3;
      }
      piVar4 = (int *)::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::size
                                ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                                 local_30);
      if (piVar4 <= tier_it._M_current) {
        ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::resize
                  ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_30,
                   (long)tier_it._M_current + 1);
      }
      this_00 = ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::operator[]
                          ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_30
                           ,(size_type)tier_it._M_current);
      pvVar5 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(this_00);
      ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::__cxx11::string_const&>(pvVar5,local_88);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

entry build_tracker_list(std::vector<std::string> const& trackers
		, std::vector<int> const& tracker_tiers)
	{
		entry ret;
		entry::list_type& tr_list = ret.list();
		if (trackers.empty()) return ret;

		tr_list.emplace_back(entry::list_type());
		std::size_t tier = 0;
		auto tier_it = tracker_tiers.begin();
		for (std::string const& tr : trackers)
		{
			if (tier_it != tracker_tiers.end())
				tier = std::clamp(std::size_t(*tier_it++), std::size_t{0}, std::size_t{1024});

			if (tr_list.size() <= tier)
				tr_list.resize(tier + 1);

			tr_list[tier].list().emplace_back(tr);
		}
		return ret;
	}